

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ButtonTests.cpp
# Opt level: O3

void __thiscall
solitaire::ButtonTests_collidesWith_Test::ButtonTests_collidesWith_Test
          (ButtonTests_collidesWith_Test *this)

{
  testing::Test::Test((Test *)this);
  (this->super_ButtonTests).super_Test._vptr_Test = (_func_int **)&PTR__ButtonTests_00319b00;
  Button::Button(&(this->super_ButtonTests).button,(Position *)&(anonymous_namespace)::position,
                 (Size *)&(anonymous_namespace)::size);
  (this->super_ButtonTests).super_Test._vptr_Test = (_func_int **)&PTR__ButtonTests_00319a50;
  return;
}

Assistant:

TEST_F(ButtonTests, collidesWith) {
    EXPECT_FALSE(button.collidesWith(position - Position {1, 0}));
    EXPECT_FALSE(button.collidesWith(position - Position {0, 1}));
    EXPECT_FALSE(button.collidesWith(bottomLeftCorner + Position {1, 0}));
    EXPECT_FALSE(button.collidesWith(bottomLeftCorner + Position {0, 1}));
    EXPECT_TRUE(button.collidesWith(position));
    EXPECT_TRUE(button.collidesWith(bottomLeftCorner));
}